

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O2

vec4 __thiscall
polyscope::render::backend_openGL3_glfw::GLAttributeBuffer::getData_vec4
          (GLAttributeBuffer *this,size_t ind)

{
  vec<4,_float,_(glm::qualifier)0> vVar1;
  vec4 vVar2;
  allocator local_39;
  string local_38;
  
  if ((this->super_AttributeBuffer).dataType != Vector4Float) {
    std::__cxx11::string::string((string *)&local_38,"bad getData type",&local_39);
    exception(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  vVar1 = getData_helper<glm::vec<4,float,(glm::qualifier)0>>(this,ind);
  vVar2.field_0 = vVar1.field_0;
  vVar2.field_1 = vVar1.field_1;
  vVar2.field_2 = vVar1.field_2;
  vVar2.field_3 = vVar1.field_3;
  return vVar2;
}

Assistant:

glm::vec4 GLAttributeBuffer::getData_vec4(size_t ind) {
  if (getType() != RenderDataType::Vector4Float) exception("bad getData type");
  return getData_helper<glm::vec4>(ind);
}